

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bin_io_text_read.cpp
# Opt level: O1

bool __thiscall
ritobin::io::impl_text_read::BinTextReader::read_array<unsigned_char,4ul>
          (BinTextReader *this,array<unsigned_char,_4UL> *value)

{
  char *pcVar1;
  bool bVar2;
  ulong in_RAX;
  byte unaff_BPL;
  ulong uVar3;
  bool end;
  undefined8 uStack_38;
  
  uStack_38 = in_RAX & 0xffffffffffffff;
  pcVar1 = (this->reader).cur_;
  bVar2 = TextReader::read_nested_begin(&this->reader,(bool *)((long)&uStack_38 + 7));
  if (bVar2) {
    if (uStack_38._7_1_ == '\0') {
      uVar3 = 0;
      do {
        if (3 < uVar3) {
          unaff_BPL = fail_msg(this,"counter < S",(this->reader).cur_);
        }
        if (uVar3 == 4) goto LAB_0013621c;
        pcVar1 = (this->reader).cur_;
        bVar2 = TextReader::read_number<unsigned_char>(&this->reader,value->_M_elems + uVar3);
        if (!bVar2) {
          unaff_BPL = fail_msg(this,"reader.read_number(value[counter])",pcVar1);
          goto LAB_0013621c;
        }
        pcVar1 = (this->reader).cur_;
        bVar2 = TextReader::read_nested_separator_or_end
                          (&this->reader,(bool *)((long)&uStack_38 + 7));
        if (!bVar2) {
          unaff_BPL = fail_msg(this,"reader.read_nested_separator_or_end(end)",pcVar1);
          goto LAB_0013621c;
        }
        uVar3 = uVar3 + 1;
      } while (uStack_38._7_1_ != '\x01');
      unaff_BPL = 1;
      if (uVar3 == 4) goto LAB_0013621c;
    }
    unaff_BPL = fail_msg(this,"counter == static_cast<uint32_t>(S)",(this->reader).cur_);
  }
  else {
    unaff_BPL = fail_msg(this,"reader.read_nested_begin(end)",pcVar1);
  }
LAB_0013621c:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool read_array(std::array<T, S>& value) noexcept {
            uint32_t counter = 0;
            bool end = false;
            bin_assert(reader.read_nested_begin(end));
            while (!end) {
                bin_assert(counter < S);
                bin_assert(reader.read_number(value[counter]));
                bin_assert(reader.read_nested_separator_or_end(end));
                counter++;
            }
            bin_assert(counter == static_cast<uint32_t>(S));
            return true;
        }